

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t archive_read_format_tar_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long lVar1;
  int64_t iVar2;
  void *pvVar3;
  undefined8 *in_RCX;
  long *in_RDX;
  long *in_RSI;
  archive *in_RDI;
  sparse_block *p;
  tar *tar;
  ssize_t bytes_read;
  uint7 in_stack_ffffffffffffffb8;
  undefined1 uVar4;
  archive_read *in_stack_ffffffffffffffc0;
  long local_30;
  
  lVar1 = *(long *)in_RDI[0x15].archive_format_name;
  while( true ) {
    while( true ) {
      uVar4 = false;
      if (*(long *)(lVar1 + 0x138) != 0) {
        uVar4 = *(long *)(*(long *)(lVar1 + 0x138) + 0x10) == 0;
      }
      if ((bool)uVar4 == false) break;
      in_stack_ffffffffffffffc0 = *(archive_read **)(lVar1 + 0x138);
      *(undefined8 *)(lVar1 + 0x138) = *(undefined8 *)&in_stack_ffffffffffffffc0->archive;
      free(in_stack_ffffffffffffffc0);
    }
    if (*(long *)(lVar1 + 0x128) != 0) {
      __archive_read_consume(in_stack_ffffffffffffffc0,(ulong)in_stack_ffffffffffffffb8);
      *(undefined8 *)(lVar1 + 0x128) = 0;
    }
    if ((*(long *)(lVar1 + 0x138) == 0) || (*(long *)(lVar1 + 0x110) == 0)) {
      iVar2 = __archive_read_consume
                        (in_stack_ffffffffffffffc0,CONCAT17(uVar4,in_stack_ffffffffffffffb8));
      if (iVar2 < 0) {
        return L'\xffffffe2';
      }
      *(undefined8 *)(lVar1 + 0x120) = 0;
      *in_RSI = 0;
      *in_RDX = 0;
      *in_RCX = *(undefined8 *)(lVar1 + 0x130);
      return L'\x01';
    }
    pvVar3 = __archive_read_ahead
                       (in_stack_ffffffffffffffc0,CONCAT17(uVar4,in_stack_ffffffffffffffb8),
                        (ssize_t *)0x1531bf);
    *in_RSI = (long)pvVar3;
    if (local_30 < 0) {
      return L'\xffffffe2';
    }
    if (*in_RSI == 0) break;
    if (*(long *)(lVar1 + 0x110) < local_30) {
      local_30 = *(long *)(lVar1 + 0x110);
    }
    if (*(long *)(*(long *)(lVar1 + 0x138) + 0x10) < local_30) {
      local_30 = *(long *)(*(long *)(lVar1 + 0x138) + 0x10);
    }
    *in_RDX = local_30;
    *in_RCX = *(undefined8 *)(*(long *)(lVar1 + 0x138) + 8);
    *(long *)(*(long *)(lVar1 + 0x138) + 0x10) =
         *(long *)(*(long *)(lVar1 + 0x138) + 0x10) - local_30;
    *(long *)(*(long *)(lVar1 + 0x138) + 8) = local_30 + *(long *)(*(long *)(lVar1 + 0x138) + 8);
    *(long *)(lVar1 + 0x110) = *(long *)(lVar1 + 0x110) - local_30;
    *(long *)(lVar1 + 0x128) = local_30;
    if (*(int *)(*(long *)(lVar1 + 0x138) + 0x18) == 0) {
      return L'\0';
    }
  }
  archive_set_error(in_RDI,-1,"Truncated tar archive");
  return L'\xffffffe2';
}

Assistant:

static int
archive_read_format_tar_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	ssize_t bytes_read;
	struct tar *tar;
	struct sparse_block *p;

	tar = (struct tar *)(a->format->data);

	for (;;) {
		/* Remove exhausted entries from sparse list. */
		while (tar->sparse_list != NULL &&
		    tar->sparse_list->remaining == 0) {
			p = tar->sparse_list;
			tar->sparse_list = p->next;
			free(p);
		}

		if (tar->entry_bytes_unconsumed) {
			__archive_read_consume(a, tar->entry_bytes_unconsumed);
			tar->entry_bytes_unconsumed = 0;
		}

		/* If we're at end of file, return EOF. */
		if (tar->sparse_list == NULL ||
		    tar->entry_bytes_remaining == 0) {
			if (__archive_read_consume(a, tar->entry_padding) < 0)
				return (ARCHIVE_FATAL);
			tar->entry_padding = 0;
			*buff = NULL;
			*size = 0;
			*offset = tar->realsize;
			return (ARCHIVE_EOF);
		}

		*buff = __archive_read_ahead(a, 1, &bytes_read);
		if (bytes_read < 0)
			return (ARCHIVE_FATAL);
		if (*buff == NULL) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Truncated tar archive");
			return (ARCHIVE_FATAL);
		}
		if (bytes_read > tar->entry_bytes_remaining)
			bytes_read = (ssize_t)tar->entry_bytes_remaining;
		/* Don't read more than is available in the
		 * current sparse block. */
		if (tar->sparse_list->remaining < bytes_read)
			bytes_read = (ssize_t)tar->sparse_list->remaining;
		*size = bytes_read;
		*offset = tar->sparse_list->offset;
		tar->sparse_list->remaining -= bytes_read;
		tar->sparse_list->offset += bytes_read;
		tar->entry_bytes_remaining -= bytes_read;
		tar->entry_bytes_unconsumed = bytes_read;

		if (!tar->sparse_list->hole)
			return (ARCHIVE_OK);
		/* Current is hole data and skip this. */
	}
}